

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall spvtools::opt::analysis::VectorConstant::~VectorConstant(VectorConstant *this)

{
  VectorConstant *this_local;
  
  ~VectorConstant(this);
  ::operator_delete(this,0x30);
  return;
}

Assistant:

VectorConstant(const Vector* ty)
      : CompositeConstant(ty), component_type_(ty->element_type()) {}